

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall
crnlib::crn_comp::optimize_alpha_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  level_details *plVar6;
  endpoint_indices_details *peVar7;
  long *plVar8;
  ushort uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  uint16 i_1;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  vector<unsigned_short> *pvVar27;
  uint16 i;
  uint uVar28;
  crn_comp *this_00;
  uint orig_size;
  ulong uVar29;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  symbol_codec codec;
  elemental_vector local_188;
  vector<unsigned_short> *local_170;
  crn_comp *local_168;
  void *local_160;
  long *local_158;
  ulong local_150;
  void *local_148;
  undefined8 uStack_140;
  uchar *local_130;
  uint local_128;
  ulong local_110;
  long local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  symbol_codec local_d8;
  unsigned_short *local_40;
  long local_38;
  
  pvVar27 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar19 = (ulong)uVar5;
  uVar21 = pvVar27->m_size;
  uVar24 = (uint)uVar5;
  uVar15 = (uint)uVar5;
  local_170 = pvVar27;
  local_158 = (long *)pData_ptr;
  if (uVar21 != uVar5) {
    if (uVar21 <= uVar5) {
      if (pvVar27->m_capacity < uVar15) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar27,uVar24,uVar21 + 1 == uVar15,2,(object_mover)0x0,false
                  );
        uVar21 = pvVar27->m_size;
      }
      memset(pvVar27->m_p + uVar21,0,(ulong)(uVar24 - uVar21) * 2);
    }
    local_170->m_size = uVar24;
  }
  local_168 = this;
  local_150 = uVar19;
  if (data == 0) {
    lVar1 = *local_158;
    local_d8.m_pDecode_buf = (uint8 *)0x0;
    local_d8.m_pDecode_buf_next = (uint8 *)0x0;
    pvVar27 = local_170;
    if (uVar19 != 0) {
      uVar21 = (uint)uVar5;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_d8,uVar21,uVar21 == 1,2,(object_mover)0x0,false);
      uVar15 = (uint)uVar5;
      local_d8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_d8.m_pDecode_buf_next._4_4_,uVar15);
      local_148 = (void *)0x0;
      uStack_140 = (unsigned_short *)0x0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_148,uVar15,uVar21 == 1,2,(object_mover)0x0,false);
      uVar25 = 0;
      memset((void *)(((ulong)uStack_140 & 0xffffffff) * 2 + (long)local_148),0,
             (ulong)(uVar15 - (uint)uStack_140) * 2);
      pvVar27 = local_170;
      uStack_140 = (unsigned_short *)CONCAT44(uStack_140._4_4_,uVar15);
      do {
        *(ushort *)((long)local_d8.m_pDecode_buf + uVar25 * 2) = *(ushort *)(lVar1 + uVar25 * 2);
        *(short *)((long)local_148 + uVar25 * 2) = (short)uVar25;
        uVar25 = uVar25 + 1;
      } while (uVar19 != uVar25);
      bVar13 = 0;
      bVar20 = 0;
      uVar25 = uVar19;
      do {
        uVar15 = 0xffffffff;
        uVar22 = 0;
        uVar21 = 0;
        do {
          iVar23 = (uint)(byte)*(ushort *)((long)local_d8.m_pDecode_buf + uVar22 * 2) - (uint)bVar13
          ;
          iVar10 = (uint)*(byte *)((long)local_d8.m_pDecode_buf + uVar22 * 2 + 1) - (uint)bVar20;
          uVar24 = iVar10 * iVar10 + iVar23 * iVar23;
          if (uVar24 < uVar15) {
            uVar15 = uVar24;
            uVar21 = (uint)uVar22;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < uVar25);
        uVar22 = (ulong)((uVar21 & 0xffff) * 2);
        bVar13 = *(byte *)((long)local_d8.m_pDecode_buf + uVar22);
        bVar20 = *(byte *)((long)local_d8.m_pDecode_buf + uVar22 + 1);
        local_170->m_p[*(ushort *)((long)local_148 + uVar22)] = uVar5 - (short)uVar25;
        *(ushort *)((long)local_d8.m_pDecode_buf + uVar22) =
             *(ushort *)((long)local_d8.m_pDecode_buf + (uVar25 - 1) * 2);
        *(undefined2 *)((long)local_148 + uVar22) =
             *(undefined2 *)((long)local_148 + uVar25 * 2 + -2);
        uVar25 = uVar25 - 1;
      } while (uVar25 != 0);
      crnlib_free(local_148);
      if ((ushort *)local_d8.m_pDecode_buf != (ushort *)0x0) {
        crnlib_free(local_d8.m_pDecode_buf);
      }
    }
    this_00 = local_168;
    optimize_alpha_selectors(local_168);
    goto LAB_00169594;
  }
  local_40 = local_170->m_p;
  local_e0 = *local_158;
  local_108 = local_158[1];
  uVar5 = *(ushort *)((long)local_158 + 0x12);
  local_160 = (void *)CONCAT44(local_160._4_4_,*(undefined4 *)((long)local_158 + 0x14));
  local_d8.m_pDecode_buf = (uint8 *)0x0;
  local_d8.m_pDecode_buf_next = (uint8 *)0x0;
  local_148 = (void *)0x0;
  uStack_140 = (unsigned_short *)0x0;
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  if (uVar19 == 0) {
    local_d8.m_pDecode_buf_next._0_4_ = 0;
LAB_00169124:
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_d8,(uint)local_d8.m_pDecode_buf_next + 1,true,2,
               (object_mover)0x0,false);
    *(ushort *)
     ((long)local_d8.m_pDecode_buf + ((ulong)local_d8.m_pDecode_buf_next & 0xffffffff) * 2) = uVar5;
    local_d8.m_pDecode_buf_next =
         (uint8 *)CONCAT44(local_d8.m_pDecode_buf_next._4_4_,(uint)local_d8.m_pDecode_buf_next + 1);
    if (uVar19 != 0) goto LAB_00169163;
  }
  else {
    elemental_vector::increase_capacity(&local_188,uVar15,uVar24 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
           (ulong)(uVar15 - local_188.m_size) << 2);
    local_188.m_size = uVar24;
    if (local_d8.m_pDecode_buf_next._4_4_ <= (uint)local_d8.m_pDecode_buf_next) goto LAB_00169124;
    *(ushort *)
     ((long)local_d8.m_pDecode_buf + ((ulong)local_d8.m_pDecode_buf_next & 0xffffffff) * 2) = uVar5;
    local_d8.m_pDecode_buf_next =
         (uint8 *)CONCAT44(local_d8.m_pDecode_buf_next._4_4_,(uint)local_d8.m_pDecode_buf_next + 1);
LAB_00169163:
    lVar1 = local_108 + (ulong)(uVar5 * uVar24) * 4;
    uVar25 = 0;
    do {
      if (uVar5 != uVar25) {
        if (uStack_140._4_4_ <= (uint)uStack_140) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_148,(uint)uStack_140 + 1,true,2,(object_mover)0x0,
                     false);
        }
        *(short *)((long)local_148 + (ulong)(uint)uStack_140 * 2) = (short)uVar25;
        uStack_140 = (unsigned_short *)CONCAT44(uStack_140._4_4_,(uint)uStack_140 + 1);
        *(undefined4 *)((long)local_188.m_p + uVar25 * 4) = *(undefined4 *)(lVar1 + uVar25 * 4);
      }
      uVar25 = uVar25 + 1;
    } while (uVar19 != uVar25);
  }
  if ((uint)uStack_140 != 0) {
    local_38 = (long)((local_160._0_4_ + 1.0) * 1000.0);
    local_e8 = 0;
    do {
      uVar19 = local_150;
      local_160 = local_188.m_p;
      uVar25 = (ulong)local_d8.m_pDecode_buf_next & 0xffffffff;
      uVar21 = (uint)local_d8.m_pDecode_buf_next - 1;
      uVar12 = (ulong)uVar21;
      local_f8 = 0;
      uVar17 = 0;
      uVar22 = 0;
      local_110 = 0;
      local_f0 = 0;
      do {
        uVar14 = (ulong)*(ushort *)((long)local_148 + (uVar22 & 0xffff) * 2);
        bVar13 = *(byte *)(local_e0 + uVar14 * 2);
        iVar10 = (uint)bVar13 -
                 (uint)*(byte *)(local_e0 + (ulong)*(ushort *)local_d8.m_pDecode_buf * 2);
        uVar15 = (uint)*(byte *)(local_e0 + 1 + uVar14 * 2);
        iVar23 = uVar15 - *(byte *)(local_e0 + 1 + (ulong)*(ushort *)local_d8.m_pDecode_buf * 2);
        uVar24 = iVar23 * iVar23 + iVar10 * iVar10;
        if (999 < uVar24) {
          uVar24 = 1000;
        }
        iVar23 = (uint)bVar13 -
                 (uint)*(byte *)(local_e0 +
                                (ulong)*(ushort *)((long)local_d8.m_pDecode_buf + uVar12 * 2) * 2);
        iVar10 = uVar15 - *(byte *)(local_e0 + 1 +
                                   (ulong)*(ushort *)((long)local_d8.m_pDecode_buf + uVar12 * 2) * 2
                                   );
        uVar15 = iVar10 * iVar10 + iVar23 * iVar23;
        if (999 < uVar15) {
          uVar15 = 1000;
        }
        uVar29 = (ulong)((int)local_38 - uVar24);
        uVar26 = (ulong)((int)local_38 - uVar15);
        uVar16 = uVar26;
        if (uVar26 < uVar29) {
          uVar16 = uVar29;
        }
        uVar16 = (uint)(*(int *)((long)local_188.m_p + uVar14 * 4) + (int)local_e8) * uVar16;
        if (uVar17 <= uVar16) {
          uVar17 = uVar16 + 1;
          local_110 = uVar26;
          local_f8 = uVar22;
          local_f0 = uVar29;
        }
        uVar15 = (int)uVar22 + 1;
        uVar22 = (ulong)uVar15;
      } while ((uVar15 & 0xffff) < (uint)uStack_140);
      uVar9 = (ushort)local_f8;
      uVar22 = local_f8 & 0xffff;
      uVar5 = *(ushort *)((long)local_148 + uVar22 * 2);
      lVar1 = local_108 + (ulong)((uint)uVar5 * (int)local_150) * 4;
      if ((int)uVar21 < 1) {
        uVar12 = 0;
        uVar17 = 0;
      }
      else {
        uVar14 = 0;
        uVar17 = 0;
        uVar15 = 0;
        do {
          iVar10 = (int)uVar12;
          uVar15 = uVar15 + *(int *)(lVar1 + (ulong)*(ushort *)
                                                     ((long)local_d8.m_pDecode_buf + uVar14 * 2) * 4
                                    ) * iVar10;
          uVar17 = (ulong)(uint)((int)uVar17 +
                                *(int *)(lVar1 + (ulong)*(ushort *)
                                                         ((long)local_d8.m_pDecode_buf +
                                                         (ulong)uVar21 * 2) * 4) * iVar10);
          uVar14 = uVar14 + 1;
          uVar21 = uVar21 - 1;
          uVar12 = (ulong)(iVar10 - 2);
        } while (((uint)local_d8.m_pDecode_buf_next - 2 >> 1) + 1 != uVar14);
        uVar12 = (ulong)uVar15;
      }
      local_e8 = (ulong)*(uint *)((long)local_188.m_p + (ulong)uVar5 * 4);
      local_100 = uVar25;
      if (uVar12 * local_f0 < uVar17 * local_110 || uVar12 * local_f0 - uVar17 * local_110 == 0) {
        if (local_d8.m_pDecode_buf_next._4_4_ <= (uint)local_d8.m_pDecode_buf_next) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_d8,(uint)local_d8.m_pDecode_buf_next + 1,true,2,
                     (object_mover)0x0,false);
          uVar25 = (ulong)local_d8.m_pDecode_buf_next & 0xffffffff;
        }
        *(ushort *)((long)local_d8.m_pDecode_buf + uVar25 * 2) = uVar5;
        local_d8.m_pDecode_buf_next =
             (uint8 *)CONCAT44(local_d8.m_pDecode_buf_next._4_4_,
                               (uint)local_d8.m_pDecode_buf_next + 1);
      }
      else {
        uVar21 = (uint)local_d8.m_pDecode_buf_next + 1;
        if (uVar21 != 0) {
          if (local_d8.m_pDecode_buf_next._4_4_ < uVar21) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_d8,uVar21,true,2,(object_mover)0x0,false);
          }
          memset((ushort *)
                 ((long)local_d8.m_pDecode_buf + (ulong)(uint)local_d8.m_pDecode_buf_next * 2),0,
                 (ulong)(uVar21 - (uint)local_d8.m_pDecode_buf_next) * 2);
        }
        local_d8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_d8.m_pDecode_buf_next._4_4_,uVar21);
        memmove((ushort *)((long)local_d8.m_pDecode_buf + 2),local_d8.m_pDecode_buf,uVar25 * 2);
        *(ushort *)local_d8.m_pDecode_buf = uVar5;
      }
      uVar21 = (uint)uStack_140;
      if (uVar9 < (uint)uStack_140) {
        memmove((void *)((long)local_148 + uVar22 * 2),(void *)((long)local_148 + uVar22 * 2 + 2),
                (ulong)((uint)uStack_140 + ~(uint)uVar9) * 2);
        uVar21 = (uint)uStack_140 - 1;
        uStack_140 = (unsigned_short *)CONCAT44(uStack_140._4_4_,uVar21);
      }
      if (uVar21 == 0) break;
      uVar21 = 1;
      do {
        lVar11 = (ulong)*(ushort *)((long)local_148 + (ulong)(uVar21 - 1 & 0xffff) * 2) * 4;
        piVar2 = (int *)((long)local_188.m_p + lVar11);
        *piVar2 = *piVar2 + *(int *)(lVar1 + lVar11);
        uVar15 = uVar21 & 0xffff;
        uVar21 = uVar21 + 1;
      } while (uVar15 < (uint)uStack_140);
    } while ((uint)uStack_140 != 0);
  }
  this_00 = local_168;
  pvVar27 = local_170;
  if (uVar19 != 0) {
    uVar25 = 0;
    do {
      local_40[*(ushort *)((long)local_d8.m_pDecode_buf + uVar25 * 2)] = (unsigned_short)uVar25;
      uVar25 = uVar25 + 1;
    } while (uVar19 != uVar25);
  }
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  if (local_148 != (void *)0x0) {
    crnlib_free(local_148);
  }
  if ((ushort *)local_d8.m_pDecode_buf != (ushort *)0x0) {
    crnlib_free(local_d8.m_pDecode_buf);
  }
LAB_00169594:
  plVar8 = local_158;
  pack_alpha_endpoints(this_00,(vector<unsigned_char> *)(local_158[3] + 0x10),pvVar27);
  iVar10 = *(int *)(plVar8[3] + 0x18);
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  if (uVar19 != 0) {
    uVar18 = (uint)uVar19;
    elemental_vector::increase_capacity(&local_188,uVar18,uVar18 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
           (ulong)(uVar18 - local_188.m_size) << 2);
    local_188.m_size = uVar18;
    pvVar27 = local_170;
  }
  uVar18 = (local_168->m_levels).m_size;
  if (uVar18 != 0) {
    bVar3 = local_168->m_has_comp[1];
    bVar4 = local_168->m_has_comp[2];
    plVar6 = (local_168->m_levels).m_p;
    uVar25 = 0;
    do {
      uVar21 = plVar6[uVar25].first_block;
      uVar22 = (ulong)uVar21;
      uVar15 = plVar6[uVar25].num_blocks + uVar21;
      if (uVar21 < uVar15) {
        peVar7 = (local_168->m_endpoint_indices).m_p;
        uVar24 = 0;
        uVar21 = 0;
        do {
          uVar28 = uVar24;
          if ((bVar3 != false) &&
             (uVar28 = (uint)pvVar27->m_p[peVar7[uVar22].field_0.field_0.alpha0],
             peVar7[uVar22].reference == '\0')) {
            piVar2 = (int *)((long)local_188.m_p +
                            (ulong)(((int)(uVar28 - uVar24) >> 0x1f & (uint)local_150) +
                                   (uVar28 - uVar24)) * 4);
            *piVar2 = *piVar2 + 1;
          }
          uVar24 = uVar28;
          uVar28 = uVar21;
          if (bVar4 != false) {
            uVar5 = pvVar27->m_p[peVar7[uVar22].field_0.field_0.alpha1];
            uVar28 = (uint)uVar5;
            if (peVar7[uVar22].reference == '\0') {
              piVar2 = (int *)((long)local_188.m_p +
                              (ulong)(((int)(uVar5 - uVar21) >> 0x1f & (uint)local_150) +
                                     (uVar5 - uVar21)) * 4);
              *piVar2 = *piVar2 + 1;
            }
          }
          uVar22 = uVar22 + 1;
          uVar21 = uVar28;
        } while (uVar15 != uVar22);
        uVar18 = (local_168->m_levels).m_size;
        uVar19 = local_150;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < uVar18);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_148);
  static_huffman_data_model::init((static_huffman_data_model *)&local_148,(EVP_PKEY_CTX *)0x1);
  if (local_128 == 0) {
    local_130 = (uchar *)0x0;
  }
  iVar10 = iVar10 << 3;
  if ((short)uVar19 != 0) {
    uVar25 = 0;
    do {
      iVar10 = iVar10 + (uint)local_130[uVar25] * *(int *)((long)local_188.m_p + uVar25 * 4);
      uVar25 = uVar25 + 1;
    } while ((uVar19 & 0xffffffff) != uVar25);
  }
  symbol_codec::symbol_codec(&local_d8);
  symbol_codec::start_encoding(&local_d8,0x10000);
  local_d8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_d8,(static_huffman_data_model *)&local_148,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_d8,false);
  *(uint *)(local_158[3] + 0x20) = iVar10 + local_d8.m_total_bits_written;
  crnlib_free(local_158);
  if (local_d8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_d8.m_output_syms.m_p);
  }
  if (local_d8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_d8.m_arith_output_buf.m_p);
  }
  if (local_d8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_d8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_148);
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha_endpoints_task(uint64 data, void* pData_ptr)
    {
        optimize_alpha_params* pParams = reinterpret_cast<optimize_alpha_params*>(pData_ptr);
        crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
        uint16 n = pParams->n;
        remapping.resize(n);

        if (data)
        {
            remap_alpha_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
        }
        else
        {
            sort_alpha_endpoints(remapping, pParams->unpacked_endpoints, n);
            optimize_alpha_selectors();
        }

        pack_alpha_endpoints(pParams->pResult->packed_endpoints, remapping);
        uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

        crnlib::vector<uint> hist(n);
        bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
        for (uint level = 0; level < m_levels.size(); level++)
        {
            for (uint alpha0_index = 0, alpha1_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++)
            {
                if (hasAlpha0)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha0]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha0_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha0_index = index;
                }
                if (hasAlpha1)
                {
                    uint index = remapping[m_endpoint_indices[b].component[cAlpha1]];
                    if (!m_endpoint_indices[b].reference)
                    {
                        int sym = index - alpha1_index;
                        hist[sym < 0 ? sym + n : sym]++;
                    }
                    alpha1_index = index;
                }
            }
        }

        static_huffman_data_model dm;
        dm.init(true, n, hist.get_ptr(), 16);
        const uint8* code_sizes = dm.get_code_sizes();
        for (uint16 s = 0; s < n; s++)
        {
            total_bits += hist[s] * code_sizes[s];
        }

        symbol_codec codec;
        codec.start_encoding(64 * 1024);
        codec.encode_enable_simulation(true);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        codec.stop_encoding(false);
        total_bits += codec.encode_get_total_bits_written();

        pParams->pResult->total_bits = total_bits;

        crnlib_delete(pParams);
    }